

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

bool __thiscall
QGraphicsItemPrivate::discardUpdateRequest
          (QGraphicsItemPrivate *this,bool ignoreVisibleBit,bool ignoreDirtyBit,bool ignoreOpacity)

{
  ulong uVar1;
  bool bVar2;
  
  if (this->scene == (QGraphicsScene *)0x0) {
    return true;
  }
  uVar1 = *(ulong *)&this->field_0x160;
  if ((uVar1 & 0x200000000000020) == 0 && !ignoreVisibleBit) {
    return true;
  }
  if (ignoreDirtyBit) {
    if (((byte)(uVar1 >> 0x3a) & 1) != 0 || ignoreOpacity) {
      return false;
    }
  }
  else {
    if ((int)uVar1 < 0 || ignoreOpacity) {
      return (bool)((byte)(uVar1 >> 0x1f) & 1);
    }
    if ((uVar1 >> 0x3a & 1) != 0) {
      return false;
    }
  }
  bVar2 = childrenCombineOpacity(this);
  if (!bVar2) {
    return false;
  }
  bVar2 = isFullyTransparent(this);
  return bVar2;
}

Assistant:

bool QGraphicsItemPrivate::discardUpdateRequest(bool ignoreVisibleBit, bool ignoreDirtyBit,
                                                bool ignoreOpacity) const
{
    // No scene, or if the scene is updating everything, means we have nothing
    // to do. The only exception is if the scene tracks the growing scene rect.
    return !scene
           || (!visible && !ignoreVisibleBit && !this->ignoreVisible)
           || (!ignoreDirtyBit && fullUpdatePending)
           || (!ignoreOpacity && !this->ignoreOpacity && childrenCombineOpacity() && isFullyTransparent());
}